

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O3

void __thiscall
luna::CodeGenerateVisitor::InsertName(CodeGenerateVisitor *this,String *name,int register_id)

{
  GenerateFunction *pGVar1;
  GenerateBlock *pGVar2;
  Function *this_00;
  size_t sVar3;
  iterator iVar4;
  size_t sVar5;
  unordered_map<luna::String_*,_luna::LocalNameInfo,_std::hash<luna::String_*>,_std::equal_to<luna::String_*>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>_>
  *this_01;
  String *local_40;
  String *local_38;
  ulong local_30;
  
  pGVar1 = this->current_function_;
  local_40 = name;
  if ((pGVar1 != (GenerateFunction *)0x0) &&
     (pGVar2 = pGVar1->current_block_, pGVar2 != (GenerateBlock *)0x0)) {
    this_00 = pGVar1->function_;
    sVar3 = Function::OpCodeSize(this_00);
    this_01 = &pGVar2->names_;
    iVar4 = std::
            _Hashtable<luna::String_*,_std::pair<luna::String_*const,_luna::LocalNameInfo>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>,_std::__detail::_Select1st,_std::equal_to<luna::String_*>,_std::hash<luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_01->_M_h,&local_40);
    if (iVar4.super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>.
        _M_cur == (__node_type *)0x0) {
      local_30 = (ulong)(uint)register_id | sVar3 << 0x20;
      local_38 = local_40;
      std::
      _Hashtable<luna::String*,std::pair<luna::String*const,luna::LocalNameInfo>,std::allocator<std::pair<luna::String*const,luna::LocalNameInfo>>,std::__detail::_Select1st,std::equal_to<luna::String*>,std::hash<luna::String*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<luna::String*,luna::LocalNameInfo>>
                ((_Hashtable<luna::String*,std::pair<luna::String*const,luna::LocalNameInfo>,std::allocator<std::pair<luna::String*const,luna::LocalNameInfo>>,std::__detail::_Select1st,std::equal_to<luna::String*>,std::hash<luna::String*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this_01);
    }
    else {
      sVar5 = Function::OpCodeSize(this_00);
      Function::AddLocalVar
                (this_00,local_40,
                 *(int *)((long)iVar4.
                                super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                                ._M_cur + 0x10),
                 *(int *)((long)iVar4.
                                super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                                ._M_cur + 0x14),(int)sVar5);
      *(ulong *)((long)iVar4.
                       super__Node_iterator_base<std::pair<luna::String_*const,_luna::LocalNameInfo>,_false>
                       ._M_cur + 0x10) = (ulong)(uint)register_id | sVar3 << 0x20;
    }
    return;
  }
  __assert_fail("current_function_ && current_function_->current_block_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x113,"void luna::CodeGenerateVisitor::InsertName(String *, int)");
}

Assistant:

void InsertName(String *name, int register_id)
        {
            assert(current_function_ && current_function_->current_block_);

            auto function = current_function_->function_;
            auto block = current_function_->current_block_;
            auto begin_pc = function->OpCodeSize();

            auto it = block->names_.find(name);
            if (it != block->names_.end())
            {
                // Add the same name variable to the function local variable list
                auto end_pc = function->OpCodeSize();
                function->AddLocalVar(name, it->second.register_id_,
                                      it->second.begin_pc_, end_pc);

                // New variable replace the old one
                it->second = LocalNameInfo(register_id, begin_pc);
            }
            else
            {
                // Variable not existed, then insert into
                LocalNameInfo local(register_id, begin_pc);
                block->names_.insert(std::make_pair(name, local));
            }
        }